

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticClient.cpp
# Opt level: O1

string * __thiscall
slang::DiagnosticClient::getFileName_abi_cxx11_
          (string *__return_storage_ptr__,DiagnosticClient *this,SourceLocation location)

{
  pointer pcVar1;
  path *ppVar2;
  string_view sVar3;
  
  if (this->absPaths == true) {
    ppVar2 = SourceManager::getFullPath_abi_cxx11_
                       (this->sourceManager,(BufferID)(location._0_4_ & 0xfffffff));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (ppVar2->_M_pathname)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (ppVar2->_M_pathname)._M_string_length);
  }
  else {
    sVar3 = SourceManager::getFileName(this->sourceManager,location);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,sVar3._M_str,sVar3._M_str + sVar3._M_len);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DiagnosticClient::getFileName(SourceLocation location) const {
    if (absPaths)
        return getU8Str(sourceManager->getFullPath(location.buffer()));
    else
        return std::string(sourceManager->getFileName(location));
}